

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawImage::Tick
          (CommandDrawImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  SBarInfoCommand **ppSVar1;
  long *plVar2;
  APlayerPawn *pAVar3;
  AInventory *pAVar4;
  PClass *p;
  PClassActor *type;
  ulong uVar5;
  FTexture *pFVar6;
  int iVar7;
  AWeapon *item;
  long lVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  FName local_34;
  
  bVar9 = (this->super_SBarInfoCommandFlowControl).truth;
  uVar5 = (ulong)(this->super_SBarInfoCommandFlowControl).commands[bVar9].
                 super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
  if (uVar5 != 0) {
    ppSVar1 = (this->super_SBarInfoCommandFlowControl).commands[bVar9].
              super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
    lVar8 = 0;
    do {
      plVar2 = *(long **)((long)ppSVar1 + lVar8);
      (**(code **)(*plVar2 + 0x28))(plVar2,block,statusBar,hudChanged);
      lVar8 = lVar8 + 8;
    } while (uVar5 << 3 != lVar8);
  }
  this->texture = (FTexture *)0x0;
  this->alpha = 1.0;
  if (this->applyscale == true) {
    this->spawnScaleY = 1.0;
    this->spawnScaleX = 1.0;
    this->applyscale = false;
  }
  iVar7 = *(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34;
  switch(iVar7) {
  case 0:
    uVar5 = (ulong)(((statusBar->super_DBaseStatusBar).CPlayer)->mo->ScoreIcon).texnum;
    break;
  case 1:
    item = (AWeapon *)statusBar->ammo1;
    goto LAB_004c3557;
  case 2:
    item = (AWeapon *)statusBar->ammo2;
    goto LAB_004c3557;
  case 3:
    item = (AWeapon *)statusBar->armor;
    if ((item == (AWeapon *)0x0) || ((item->super_AStateProvider).super_AInventory.Amount == 0))
    goto LAB_004c3589;
    goto LAB_004c355c;
  case 4:
    item = ((statusBar->super_DBaseStatusBar).CPlayer)->ReadyWeapon;
LAB_004c3557:
    if (item != (AWeapon *)0x0) {
LAB_004c355c:
      GetIcon(this,(AInventory *)item);
    }
    goto LAB_004c3589;
  case 5:
    pAVar3 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    local_34.Index = 0x5b;
    p = PClass::FindClass(&local_34);
    type = dyn_cast<PClassActor>((DObject *)p);
    pAVar4 = AActor::FindInventory(&pAVar3->super_AActor,type,false);
    if (pAVar4 == (AInventory *)0x0) goto LAB_004c3589;
LAB_004c34ed:
    uVar5 = (ulong)(pAVar4->Icon).texnum;
    break;
  case 6:
  case 7:
  case 8:
  case 9:
    pAVar4 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        (PClassActor *)AHexenArmor::RegistrationInfo.MyClass,false);
    if (pAVar4 == (AInventory *)0x0) goto LAB_004c3589;
    if (*(double *)(&pAVar4->InterHubAmount + (long)iVar7 * 2) <= 0.0) {
      return;
    }
    if (*(double *)(&pAVar4->PickupSound + (long)iVar7 * 2) <= 0.0) {
      return;
    }
    dVar10 = *(double *)(&pAVar4->InterHubAmount + (long)iVar7 * 2) /
             *(double *)(&pAVar4->PickupSound + (long)iVar7 * 2);
    dVar11 = 1.0;
    if (dVar10 <= 1.0) {
      dVar11 = dVar10;
    }
    this->alpha = dVar11 * this->alpha;
    iVar7 = this->image;
    goto LAB_004c3580;
  case 10:
    uVar5 = (ulong)(this->sprite).texnum;
    break;
  default:
    goto switchD_004c33f7_caseD_b;
  case 0xc:
    pAVar3 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar4 = (pAVar3->InvSel).field_0.p;
    if (pAVar4 != (AInventory *)0x0) {
      if (((pAVar4->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar4 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel).field_0.p;
        goto LAB_004c34ed;
      }
      (pAVar3->InvSel).field_0.p = (AInventory *)0x0;
    }
switchD_004c33f7_caseD_b:
    iVar7 = this->image;
    if (iVar7 < 0) goto LAB_004c3589;
LAB_004c3580:
    pFVar6 = FImageCollection::operator[](&statusBar->Images,iVar7);
    goto LAB_004c3585;
  }
  if (uVar5 < TexMan.Textures.Count) {
    pFVar6 = TexMan.Textures.Array[TexMan.Translation.Array[uVar5]].Texture;
  }
  else {
    pFVar6 = (FTexture *)0x0;
  }
LAB_004c3585:
  this->texture = pFVar6;
LAB_004c3589:
  if ((this->flags & 0x80) != 0) {
    if (this->texture == (FTexture *)0x0) {
      bVar9 = true;
    }
    else {
      bVar9 = this->texture->UseType == '\r';
    }
    if (((this->super_SBarInfoCommandFlowControl).truth != bVar9) &&
       ((this->super_SBarInfoCommandFlowControl).truth = bVar9, block != (SBarInfoMainBlock *)0x0))
    {
      (*(this->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
                (this,block,statusBar,1);
    }
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			texture = NULL;
			alpha = 1.;
			if (applyscale)
			{
				spawnScaleX = spawnScaleY = 1.0f;
				applyscale = false;
			}
			if(type == PLAYERICON)
				texture = TexMan(statusBar->CPlayer->mo->ScoreIcon);
			else if(type == AMMO1)
			{
				AAmmo *ammo = statusBar->ammo1;
				if(ammo != NULL)
					GetIcon(ammo);
			}
			else if(type == AMMO2)
			{
				AAmmo *ammo = statusBar->ammo2;
				if(ammo != NULL)
					GetIcon(ammo);
			}
			else if(type == ARMOR)
			{
				ABasicArmor *armor = statusBar->armor;
				if(armor != NULL && armor->Amount != 0)
					GetIcon(armor);
			}
			else if(type == WEAPONICON)
			{
				AWeapon *weapon = statusBar->CPlayer->ReadyWeapon;
				if(weapon != NULL)
					GetIcon(weapon);
			}
			else if(type == SIGIL)
			{
				AInventory *item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(NAME_Sigil));
				if (item != NULL)
					texture = TexMan(item->Icon);
			}
			else if(type == HEXENARMOR_ARMOR || type == HEXENARMOR_SHIELD || type == HEXENARMOR_HELM || type == HEXENARMOR_AMULET)
			{
				int armorType = type - HEXENARMOR_ARMOR;
			
				AHexenArmor *harmor = statusBar->CPlayer->mo->FindInventory<AHexenArmor>();
				if (harmor != NULL)
				{
					if (harmor->Slots[armorType] > 0 && harmor->SlotsIncrement[armorType] > 0)
					{
						//combine the alpha values
						alpha *= MIN(1., harmor->Slots[armorType] / harmor->SlotsIncrement[armorType]);
						texture = statusBar->Images[image];
					}
					else
						return;
				}
			}
			else if(type == INVENTORYICON)
				texture = TexMan(sprite);
			else if(type == SELECTEDINVENTORYICON && statusBar->CPlayer->mo->InvSel != NULL)
				texture = TexMan(statusBar->CPlayer->mo->InvSel->Icon);
			else if(image >= 0)
				texture = statusBar->Images[image];
			
			if (flags & DI_ALTERNATEONFAIL)
			{
				SetTruth(texture == NULL || texture->UseType == FTexture::TEX_Null, block, statusBar);
			}
		}